

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

BOOL __thiscall Js::LocalsWalker::Get(LocalsWalker *this,int i,ResolvedObject *pResolvedObject)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 extraout_var;
  Type *ppVVar6;
  undefined4 *puVar7;
  _func_int *UNRECOVERED_JUMPTABLE;
  List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  Type pVVar8;
  int iVar9;
  uint uVar10;
  uint local_34;
  
  if ((int)this->totalLocalsCount <= i) {
    return 0;
  }
  local_34 = i;
  iVar3 = (*this->pFrame->_vptr_DiagStackFrame[10])();
  pResolvedObject->scriptContext = (ScriptContext *)CONCAT44(extraout_var,iVar3);
  BVar4 = VariableWalkerBase::GetExceptionObject((int *)&local_34,this->pFrame,pResolvedObject);
  if ((BVar4 != 0) ||
     (BVar4 = VariableWalkerBase::GetReturnedValue((int *)&local_34,this->pFrame,pResolvedObject),
     BVar4 != 0)) {
    return 1;
  }
  if (this->hasUserNotDefinedArguments == true) {
    if (local_34 == 0) {
      CreateArgumentsObject(this,pResolvedObject);
      return 1;
    }
    local_34 = local_34 - 1;
  }
  this_00 = this->pVarWalkers;
  if (this_00 ==
      (List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    return 0;
  }
  iVar3 = (this_00->
          super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).
          count;
  if (iVar3 == 0) {
    return 0;
  }
  uVar10 = local_34;
  if ((this->frameWalkerFlags & 1) != 0) {
    for (iVar9 = 0; iVar9 < iVar3; iVar9 = iVar9 + 1) {
      ppVVar6 = JsUtil::
                List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_00,iVar9);
      pVVar8 = *ppVVar6;
      if ((UIGroupType_Param < pVVar8->groupType) ||
         ((0x13U >> (pVVar8->groupType & 0x1f) & 1) == 0)) {
        this_00 = this->pVarWalkers;
        iVar3 = (this_00->
                super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                ).count;
        break;
      }
      iVar5 = (*(pVVar8->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase[1])
                        (pVVar8);
      if ((int)uVar10 < iVar5) {
        UNRECOVERED_JUMPTABLE =
             *(pVVar8->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase;
LAB_007e9967:
        iVar3 = (*UNRECOVERED_JUMPTABLE)(pVVar8,(ulong)uVar10,pResolvedObject);
        return iVar3;
      }
      this_00 = this->pVarWalkers;
      iVar3 = (this_00->
              super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>)
              .count;
      uVar10 = uVar10 - iVar5;
    }
    if (iVar3 <= (int)(uVar10 + iVar9)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0x526,"((i + startScopeIndex) < pVarWalkers->Count())",
                                  "(i + startScopeIndex) < pVarWalkers->Count()");
      if (!bVar2) goto LAB_007e9a00;
      *puVar7 = 0;
      this_00 = this->pVarWalkers;
    }
    ppVVar6 = JsUtil::
              List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(this_00,uVar10 + iVar9);
    BVar4 = VariableWalkerBase::GetGroupObject(*ppVVar6,pResolvedObject);
    return BVar4;
  }
  for (iVar9 = 0; iVar9 < iVar3; iVar9 = iVar9 + 1) {
    ppVVar6 = JsUtil::
              List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(this_00,iVar9);
    iVar5 = (*((*ppVVar6)->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase[1])();
    if ((int)uVar10 < iVar5) {
      ppVVar6 = JsUtil::
                List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this->pVarWalkers,iVar9);
      pVVar8 = *ppVVar6;
      UNRECOVERED_JUMPTABLE =
           *(pVVar8->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase;
      goto LAB_007e9967;
    }
    this_00 = this->pVarWalkers;
    iVar3 = (this_00->
            super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).
            count;
    uVar10 = uVar10 - iVar5;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar7 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                              ,0x4ff,"(0)","FALSE");
  if (bVar2) {
    *puVar7 = 0;
    return 0;
  }
LAB_007e9a00:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

BOOL LocalsWalker::Get(int i, ResolvedObject* pResolvedObject)
    {
        if (i >= (int)totalLocalsCount)
        {
            return FALSE;
        }

        pResolvedObject->scriptContext = pFrame->GetScriptContext();

        if (VariableWalkerBase::GetExceptionObject(i, pFrame, pResolvedObject))
        {
            return TRUE;
        }

#ifdef ENABLE_MUTATION_BREAKPOINT
        // Pending mutation display should be before any return value
        if (VariableWalkerBase::GetBreakMutationBreakpointValue(i, pFrame, pResolvedObject))
        {
            return TRUE;
        }
#endif

        if (VariableWalkerBase::GetReturnedValue(i, pFrame, pResolvedObject))
        {
            return TRUE;
        }

        if (hasUserNotDefinedArguments)
        {
            if (i == 0)
            {
                return CreateArgumentsObject(pResolvedObject);
            }
            i--;
        }

        if (!pVarWalkers || pVarWalkers->Count() == 0)
        {
            return FALSE;
        }

        // In the case of not making groups, all variables will be arranged
        // as one int32 list in the locals window.
        if (!ShouldMakeGroups())
        {
            for (int j = 0; j < pVarWalkers->Count(); j++)
            {
                int count = pVarWalkers->Item(j)->GetChildrenCount();
                if (i < count)
                {
                    return pVarWalkers->Item(j)->Get(i, pResolvedObject);
                }
                i-= count;
            }

            Assert(FALSE);
            return FALSE;
        }

        int startScopeIndex = 0;

        // Need to determine what range of local variables we're in for the requested index.
        // Non-grouped local variables are organized with reg slot coming first, then followed by
        // scope slot/activation object variables. Catch and with variables follow next
        // and group variables are stored last which come from upper scopes that
        // are accessed in this function (those passed down as part of a closure).
        // Note that all/any/none of these walkers may be present.
        // Example variable layout:
        // [0-2] - Reg slot vars.
        // [3-4] - Scope slot array vars.
        // [5-8] - Global vars (stored on the global object as properties).
        for (int j = 0; j < pVarWalkers->Count(); ++j)
        {
            VariableWalkerBase *variableWalker = pVarWalkers->Item(j);
            if (!variableWalker->IsInGroup())
            {
                int count = variableWalker->GetChildrenCount();

                if (i < count)
                {
                    return variableWalker->Get(i, pResolvedObject);
                }
                i-= count;
                startScopeIndex++;
            }
            else
            {
                // We've finished with all walkers for the current locals level so
                // break out in order to handle the groups.
                break;
            }
        }

        // Handle groups.
        Assert((i + startScopeIndex) < pVarWalkers->Count());
        VariableWalkerBase *variableWalker = pVarWalkers->Item(i + startScopeIndex);
        return variableWalker->GetGroupObject(pResolvedObject);
    }